

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O2

int lws_hdr_simple_create(lws *wsi,lws_token_indexes h,char *s)

{
  uint16_t *puVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  allocated_headers *paVar5;
  int iVar6;
  uint8_t uVar7;
  
  paVar5 = (wsi->http).ah;
  if (*s == '\0') {
    paVar5->frag_index[h] = '\0';
    iVar6 = 0;
  }
  else {
    uVar7 = paVar5->nfrag + '\x01';
    paVar5->nfrag = uVar7;
    if (uVar7 == '_') {
      _lws_log(2,"More hdr frags than we can deal with, dropping\n");
      iVar6 = -1;
    }
    else {
      paVar5->frag_index[h] = uVar7;
      paVar5 = (wsi->http).ah;
      bVar2 = paVar5->nfrag;
      paVar5->frags[bVar2].offset = paVar5->pos;
      paVar5->frags[bVar2].len = 0;
      paVar5->frags[bVar2].nfrag = '\0';
      do {
        iVar6 = lws_pos_in_bounds(wsi);
        if (iVar6 != 0) {
          return -1;
        }
        cVar3 = *s;
        paVar5 = (wsi->http).ah;
        uVar4 = paVar5->pos;
        paVar5->pos = uVar4 + 1;
        paVar5->data[uVar4] = cVar3;
        iVar6 = 0;
        if (*s == '\0') {
          return 0;
        }
        paVar5 = (wsi->http).ah;
        puVar1 = &paVar5->frags[paVar5->nfrag].len;
        *puVar1 = *puVar1 + 1;
        cVar3 = *s;
        s = s + 1;
      } while (cVar3 != '\0');
    }
  }
  return iVar6;
}

Assistant:

int LWS_WARN_UNUSED_RESULT
lws_hdr_simple_create(struct lws *wsi, enum lws_token_indexes h, const char *s)
{
	if (!*s) {
		/*
		 * If we get an empty string, then remove any entry for the
		 * header
		 */
		wsi->http.ah->frag_index[h] = 0;

		return 0;
	}

	wsi->http.ah->nfrag++;
	if (wsi->http.ah->nfrag == LWS_ARRAY_SIZE(wsi->http.ah->frags)) {
		lwsl_warn("More hdr frags than we can deal with, dropping\n");
		return -1;
	}

	wsi->http.ah->frag_index[h] = wsi->http.ah->nfrag;

	wsi->http.ah->frags[wsi->http.ah->nfrag].offset = wsi->http.ah->pos;
	wsi->http.ah->frags[wsi->http.ah->nfrag].len = 0;
	wsi->http.ah->frags[wsi->http.ah->nfrag].nfrag = 0;

	do {
		if (lws_pos_in_bounds(wsi))
			return -1;

		wsi->http.ah->data[wsi->http.ah->pos++] = *s;
		if (*s)
			wsi->http.ah->frags[wsi->http.ah->nfrag].len++;
	} while (*s++);

	return 0;
}